

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Roadmap.cpp
# Opt level: O0

bool reachedGoal(RVOSimulator *sim)

{
  ulong uVar1;
  size_t sVar2;
  Vector2 *this;
  reference pvVar3;
  reference vector;
  float fVar4;
  Vector2 local_28;
  ulong local_20;
  size_t i;
  RVOSimulator *sim_local;
  
  local_20 = 0;
  i = (size_t)sim;
  while( true ) {
    uVar1 = local_20;
    sVar2 = RVO::RVOSimulator::getNumAgents((RVOSimulator *)i);
    if (sVar2 <= uVar1) {
      return true;
    }
    this = RVO::RVOSimulator::getAgentPosition((RVOSimulator *)i,local_20);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&goals,local_20);
    vector = std::vector<RoadmapVertex,_std::allocator<RoadmapVertex>_>::operator[]
                       (&roadmap,(long)*pvVar3);
    local_28 = RVO::Vector2::operator-(this,&vector->position);
    fVar4 = RVO::absSq(&local_28);
    if (400.0 < fVar4) break;
    local_20 = local_20 + 1;
  }
  return false;
}

Assistant:

bool reachedGoal(RVO::RVOSimulator *sim)
{
	/* Check if all agents have reached their goals. */
	for (size_t i = 0; i < sim->getNumAgents(); ++i) {
		if (RVO::absSq(sim->getAgentPosition(i) - roadmap[goals[i]].position) > 20.0f * 20.0f) {
			return false;
		}
	}

	return true;
}